

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdp.cpp
# Opt level: O2

void __thiscall despot::MDP::ComputeBlindAlpha(MDP *this)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  log_ostream *plVar6;
  ostream *poVar7;
  int s_1;
  ulong uVar8;
  double *pdVar9;
  int s_2;
  int s;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  double extraout_XMM0_Qa;
  double dVar15;
  double extraout_XMM0_Qa_00;
  double dVar16;
  double local_98;
  allocator_type local_89;
  int local_88;
  int local_84;
  vector<double,_std::allocator<double>_> cur;
  double local_60;
  vector<double,_std::allocator<double>_> prev;
  
  uVar2 = (*this->_vptr_MDP[2])();
  uVar3 = (*this->_vptr_MDP[3])(this);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->blind_alpha_,(long)(int)uVar3);
  local_60 = INFINITY;
  local_84 = 1;
  local_88 = 3;
  uVar10 = 0;
  uVar11 = 0;
  if (0 < (int)uVar2) {
    uVar11 = (ulong)uVar2;
  }
  uVar13 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar13 = uVar10;
  }
  do {
    if (uVar10 == uVar13) {
      return;
    }
    std::vector<double,_std::allocator<double>_>::vector
              (&cur,(long)(int)uVar2,(allocator_type *)&prev);
    std::vector<double,_std::allocator<double>_>::vector(&prev,(long)(int)uVar2,&local_89);
    uVar8 = 0;
    dVar16 = local_60;
    while( true ) {
      if ((int)uVar11 == (int)uVar8) break;
      (*this->_vptr_MDP[5])(this,uVar8,uVar10 & 0xffffffff);
      dVar15 = extraout_XMM0_Qa;
      if (dVar16 <= extraout_XMM0_Qa) {
        dVar15 = dVar16;
      }
      uVar8 = (ulong)((int)uVar8 + 1);
      dVar16 = dVar15;
    }
    for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
      cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar8] = dVar16 / (1.0 - DAT_0019fdd8);
    }
    iVar12 = 0;
    local_98 = 0.0;
    do {
      if (iVar12 == 1000) {
        iVar12 = 1000;
        break;
      }
      for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
        prev.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar8] =
             cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start[uVar8];
      }
      local_98 = 0.0;
      for (uVar8 = 0; uVar8 != uVar11; uVar8 = uVar8 + 1) {
        cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar8] = 0.0;
        iVar4 = (*this->_vptr_MDP[4])(this,uVar8 & 0xffffffff,uVar10 & 0xffffffff);
        lVar1 = *(long *)CONCAT44(extraout_var,iVar4);
        lVar5 = ((long *)CONCAT44(extraout_var,iVar4))[1] - lVar1 >> 5;
        pdVar9 = (double *)(lVar1 + 0x18);
        while (bVar14 = lVar5 != 0, lVar5 = lVar5 + -1, bVar14) {
          if ((long)*(int *)((long)pdVar9 + -0xc) < 0) {
            __assert_fail("next.state_id >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/core/mdp.cpp"
                          ,0x61,"virtual void despot::MDP::ComputeBlindAlpha()");
          }
          cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar8] =
               *pdVar9 * prev.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[*(int *)((long)pdVar9 + -0xc)] +
               cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8];
          pdVar9 = pdVar9 + 4;
        }
        (*this->_vptr_MDP[5])(this,uVar8 & 0xffffffff,uVar10 & 0xffffffff);
        dVar16 = DAT_0019fdd8 *
                 cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8] + extraout_XMM0_Qa_00;
        cur.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar8] = dVar16;
        local_98 = local_98 +
                   ABS(dVar16 - prev.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar8]);
      }
      iVar12 = iVar12 + 1;
    } while (0.0001 <= local_98);
    iVar4 = logging::level();
    if ((local_84 <= iVar4) && (iVar4 = logging::level(), local_88 <= iVar4)) {
      plVar6 = logging::stream(local_88);
      poVar7 = std::operator<<(&plVar6->super_ostream,"[MDP::ComputeBlindAlpha] Tol(alpha_");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar10);
      poVar7 = std::operator<<(poVar7,") after ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar12);
      std::operator<<(poVar7," iters = ");
      poVar7 = std::ostream::_M_insert<double>(local_98);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    std::vector<double,_std::allocator<double>_>::operator=
              ((this->blind_alpha_).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar10,&cur);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&prev.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&cur.super__Vector_base<double,_std::allocator<double>_>);
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void MDP::ComputeBlindAlpha() {
	int num_states = NumStates(), num_actions = NumActions();

	blind_alpha_.resize(num_actions);

	for (ACT_TYPE action = 0; action < num_actions; action++) {
		vector<double> cur(num_states), prev(num_states);

		double min = Globals::POS_INFTY;
		for (int s = 0; s < num_states; s++) {
			double reward = Reward(s, action);
			if (reward < min)
				min = reward;
		}

		for (int s = 0; s < num_states; s++)
			cur[s] = min / (1 - Globals::Discount());

		double tol = 0;
		int iter = 0;
		for (iter = 0; iter < 1000; iter++) {
			tol = 0;

			for (int s = 0; s < num_states; s++)
				prev[s] = cur[s];

			for (int s = 0; s < num_states; s++) {
				cur[s] = 0;
				const vector<State>& transition = TransitionProbability(s,
					action);
				for (int i = 0; i < transition.size(); i++) {
					const State& next = transition[i];
					assert(next.state_id >= 0);
					cur[s] += next.weight * prev[next.state_id];
				}
				cur[s] = Reward(s, action) + Globals::Discount() * cur[s];

				tol += abs(cur[s] - prev[s]);
			}

			if (tol < 0.0001) {
				iter++;
				break;
			}
		}
		logi << "[MDP::ComputeBlindAlpha] Tol(alpha_" << action << ") after " << iter << " iters = "
			<< tol << endl;

		blind_alpha_[action] = cur;
	}
}